

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

bool __thiscall wasm::LocalGraph::isSSA(LocalGraph *this,Index x)

{
  size_type sVar1;
  Index local_14;
  LocalGraph *pLStack_10;
  Index x_local;
  LocalGraph *this_local;
  
  local_14 = x;
  pLStack_10 = this;
  sVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                    (&(this->super_LocalGraphBase).SSAIndexes,&local_14);
  return sVar1 != 0;
}

Assistant:

bool LocalGraph::isSSA(Index x) { return SSAIndexes.count(x); }